

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LiteralExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LiteralExpressionSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1)

{
  Token literal;
  LiteralExpressionSyntax *this_00;
  Token *args_local_1;
  SyntaxKind *args_local;
  BumpAllocator *this_local;
  
  this_00 = (LiteralExpressionSyntax *)allocate(this,0x20,8);
  literal.kind = args_1->kind;
  literal._2_1_ = args_1->field_0x2;
  literal.numFlags.raw = (args_1->numFlags).raw;
  literal.rawLen = args_1->rawLen;
  literal.info = args_1->info;
  slang::syntax::LiteralExpressionSyntax::LiteralExpressionSyntax(this_00,*args,literal);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }